

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

int If_CutPerformCheck16(If_Man_t *p,uint *pTruth0,int nVars,int nLeaves,char *pStr)

{
  If_Par_t *pIVar1;
  ulong uVar2;
  uint uVar3;
  size_t sVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  int nLutRoot;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong *puVar13;
  int iVar14;
  ulong *puVar15;
  uint uVar16;
  int iVar17;
  int nLutLeaf;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong *puVar23;
  ulong uVar24;
  long lVar25;
  ulong *puVar26;
  word *tLimit;
  uint pTruth [1024];
  If_Grp_t local_104a;
  ulong local_1038 [513];
  
  if (nVars < 6) {
    __assert_fail("nVars >= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x8ae,"int If_CutPerformCheck16(If_Man_t *, unsigned int *, int, int, char *)");
  }
  iVar8 = nVars + -6;
  uVar3 = 1 << ((byte)iVar8 & 0x1f);
  puVar23 = local_1038;
  memcpy(puVar23,pTruth0,(long)(int)uVar3 * 8);
  pIVar1 = p->pPars;
  iVar17 = pIVar1->nLutSize;
  if (iVar17 != nLeaves) {
    if (iVar17 <= nLeaves) {
      __assert_fail("nVarS < nVarB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x47d,"void Abc_TtStretch6(word *, int, int)");
    }
    uVar10 = 1 << ((char)nLeaves - 6U & 0x1f);
    if (nLeaves < 7) {
      uVar10 = 1;
    }
    uVar16 = 1 << ((char)iVar17 - 6U & 0x1f);
    if (iVar17 < 7) {
      uVar16 = 1;
    }
    if (uVar10 != uVar16) {
      if ((int)uVar16 <= (int)uVar10) {
        __assert_fail("step < nWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x482,"void Abc_TtStretch6(word *, int, int)");
      }
      if (0 < (int)uVar16) {
        lVar19 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar20 = 0;
            do {
              puVar23[uVar20] = local_1038[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar10 != uVar20);
          }
          lVar19 = lVar19 + (int)uVar10;
          puVar23 = puVar23 + (int)uVar10;
        } while (lVar19 < (long)(ulong)uVar16);
      }
    }
  }
  uVar10 = nLeaves;
  if (pIVar1->fCutMin == 0) {
    if (nVars < nLeaves) {
      __assert_fail("nVars <= nVarsAll",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x75b,"int Abc_TtMinBase(word *, int *, int, int)");
    }
    if (0 < nLeaves) {
      puVar23 = local_1038 + (int)uVar3;
      if ((int)uVar3 < 2) {
        uVar3 = 1;
      }
      uVar20 = 0;
      uVar10 = 0;
LAB_0041508e:
      bVar5 = (byte)uVar20;
      bVar7 = (byte)uVar10;
      if (nVars == 6) {
        bVar5 = (byte)(1 << (bVar5 & 0x1f));
        if ((s_Truths6Neg[uVar20] & (local_1038[0] >> (bVar5 & 0x3f) ^ local_1038[0])) == 0)
        goto LAB_00415475;
        lVar19 = (long)(int)uVar10;
        if (lVar19 < (long)uVar20) {
          bVar5 = (char)(-1 << (bVar7 & 0x1f)) + bVar5;
          local_1038[0] =
               (local_1038[0] & *(ulong *)(lVar19 * 0x90 + 0x9ba160 + uVar20 * 0x18)) >>
               (bVar5 & 0x3f) |
               (*(ulong *)(lVar19 * 0x90 + 0x9ba158 + uVar20 * 0x18) & local_1038[0]) <<
               (bVar5 & 0x3f) | s_PPMasks[lVar19][uVar20][0] & local_1038[0];
        }
        goto LAB_00415456;
      }
      if (uVar20 < 6) {
        if (iVar8 != 0x1f) {
          uVar18 = 0;
          do {
            if (((local_1038[uVar18] >> ((byte)(1 << (bVar5 & 0x1f)) & 0x3f) ^ local_1038[uVar18]) &
                s_Truths6Neg[uVar20]) != 0) goto LAB_004151e8;
            uVar18 = uVar18 + 1;
          } while (uVar3 != uVar18);
        }
      }
      else if (iVar8 != 0x1f) {
        bVar6 = (byte)(uVar20 - 6);
        uVar16 = 1 << (bVar6 & 0x1f);
        iVar17 = 2 << (bVar6 & 0x1f);
        uVar18 = 1;
        if (1 < (int)uVar16) {
          uVar18 = (ulong)uVar16;
        }
        puVar15 = local_1038 + (int)uVar16;
        puVar12 = local_1038;
        do {
          if (uVar20 - 6 != 0x1f) {
            uVar11 = 0;
            do {
              if (puVar12[uVar11] != puVar15[uVar11]) goto LAB_004151e8;
              uVar11 = uVar11 + 1;
            } while (uVar18 != uVar11);
          }
          puVar12 = puVar12 + iVar17;
          puVar15 = puVar15 + iVar17;
        } while (puVar12 < puVar23);
      }
      goto LAB_00415475;
    }
    uVar10 = 0;
LAB_00415485:
    if (nLeaves < (int)uVar10) {
      __assert_fail("k < nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
    }
  }
  sVar4 = strlen(pStr);
  iVar17 = (int)sVar4;
  if (iVar17 - 4U < 0xfffffffe) {
    uVar3 = 0;
    printf("Wrong LUT struct (%s)\n",pStr);
  }
  else {
    uVar20 = 0;
    do {
      if ((byte)(pStr[uVar20] - 0x37U) < 0xfc) {
        printf("The LUT size (%d) should belong to {3,4,5,6}.\n",(ulong)((int)pStr[uVar20] - 0x30));
        return 0;
      }
      uVar20 = uVar20 + 1;
    } while ((sVar4 & 0xffffffff) != uVar20);
    iVar8 = 0;
    if (iVar17 == 3) {
      iVar8 = pStr[1] + -0x30;
    }
    iVar14 = iVar8 + -1;
    if (iVar8 == 0) {
      iVar14 = 0;
    }
    if ((int)pStr[iVar17 - 1] + iVar14 + *pStr + -0x61 < (int)uVar10) {
      uVar3 = 0;
      printf("The cut size (%d) is too large for the LUT structure %s.\n",(ulong)uVar10,pStr);
    }
    else {
      nLutLeaf = *pStr + -0x30;
      nLutRoot = pStr[iVar17 - 1] + -0x30;
      iVar14 = nLutRoot;
      if (nLutRoot < nLutLeaf) {
        iVar14 = nLutLeaf;
      }
      if (iVar14 < iVar8) {
        iVar14 = iVar8;
      }
      uVar3 = 1;
      if (iVar14 < (int)uVar10) {
        if (iVar17 == 2) {
          If_CluCheck(&local_104a,p,local_1038,uVar10,0,0,nLutLeaf,nLutRoot,(If_Grp_t *)0x0,
                      (word *)0x0,(word *)0x0,(word *)0x0,1);
        }
        else {
          If_CluCheck3(&local_104a,p,local_1038,uVar10,nLutLeaf,iVar8,nLutRoot,(If_Grp_t *)0x0,
                       (If_Grp_t *)0x0,(word *)0x0,(word *)0x0,(word *)0x0);
        }
        uVar3 = (uint)('\0' < local_104a.nVars);
      }
    }
  }
  return uVar3;
LAB_004151e8:
  lVar19 = (long)(int)uVar10;
  if (lVar19 < (long)uVar20) {
    if (uVar20 < 6) {
      if (iVar8 != 0x1f) {
        bVar5 = (char)(1 << (bVar5 & 0x1f)) + (char)(-1 << (bVar7 & 0x1f));
        uVar18 = s_PPMasks[lVar19][uVar20][0];
        uVar11 = *(ulong *)(lVar19 * 0x90 + 0x9ba158 + uVar20 * 0x18);
        uVar24 = *(ulong *)(lVar19 * 0x90 + 0x9ba160 + uVar20 * 0x18);
        uVar21 = 0;
        do {
          uVar2 = local_1038[uVar21];
          local_1038[uVar21] =
               (uVar2 & uVar24) >> (bVar5 & 0x3f) |
               (uVar2 & uVar11) << (bVar5 & 0x3f) | uVar2 & uVar18;
          uVar21 = uVar21 + 1;
        } while (uVar3 != uVar21);
      }
    }
    else if ((int)uVar10 < 6) {
      if (iVar8 != 0x1f) {
        bVar5 = (byte)(uVar20 - 6);
        uVar16 = 1 << (bVar5 & 0x1f);
        iVar17 = 2 << (bVar5 & 0x1f);
        uVar18 = 1;
        if (1 < (int)uVar16) {
          uVar18 = (ulong)uVar16;
        }
        puVar15 = local_1038 + (int)uVar16;
        puVar12 = local_1038;
        do {
          if (uVar20 - 6 != 0x1f) {
            uVar11 = Truth6[lVar19];
            uVar24 = 0;
            do {
              uVar21 = puVar12[uVar24];
              bVar5 = (byte)(1 << (bVar7 & 0x1f));
              uVar2 = puVar15[uVar24];
              puVar12[uVar24] = uVar21 & ~uVar11 | uVar2 << (bVar5 & 0x3f) & uVar11;
              puVar15[uVar24] = uVar2 & uVar11 | (uVar21 & uVar11) >> (bVar5 & 0x3f);
              uVar24 = uVar24 + 1;
            } while (uVar18 != uVar24);
          }
          puVar12 = puVar12 + iVar17;
          puVar15 = puVar15 + iVar17;
        } while (puVar12 < puVar23);
      }
    }
    else if (iVar8 != 0x1f) {
      bVar5 = (byte)(uVar20 - 6);
      bVar7 = (byte)(uVar10 - 6);
      uVar16 = 1 << (bVar7 & 0x1f);
      iVar17 = 2 << (bVar5 & 0x1f);
      uVar18 = 1;
      if (1 < (int)uVar16) {
        uVar18 = (ulong)uVar16;
      }
      lVar25 = (long)(2 << (bVar7 & 0x1f));
      lVar19 = (long)(1 << (bVar5 & 0x1f));
      puVar15 = local_1038 + lVar19;
      puVar22 = local_1038 + (int)uVar16;
      puVar12 = local_1038;
      do {
        if (uVar20 - 6 != 0x1f) {
          lVar9 = 0;
          puVar13 = puVar15;
          puVar26 = puVar22;
          do {
            if (uVar10 - 6 != 0x1f) {
              uVar11 = 0;
              do {
                uVar24 = puVar26[uVar11];
                puVar26[uVar11] = puVar13[uVar11];
                puVar13[uVar11] = uVar24;
                uVar11 = uVar11 + 1;
              } while (uVar18 != uVar11);
            }
            lVar9 = lVar9 + lVar25;
            puVar13 = puVar13 + lVar25;
            puVar26 = puVar26 + lVar25;
          } while (lVar9 < lVar19);
        }
        puVar12 = puVar12 + iVar17;
        puVar15 = puVar15 + iVar17;
        puVar22 = puVar22 + iVar17;
      } while (puVar12 < puVar23);
    }
  }
LAB_00415456:
  uVar10 = uVar10 + 1;
LAB_00415475:
  uVar20 = uVar20 + 1;
  if (uVar20 == (uint)nLeaves) goto LAB_00415485;
  goto LAB_0041508e;
}

Assistant:

int If_CutPerformCheck16( If_Man_t * p, unsigned * pTruth0, int nVars, int nLeaves, char * pStr )
{
    unsigned pTruth[IF_MAX_FUNC_LUTSIZE > 5 ? 1 << (IF_MAX_FUNC_LUTSIZE - 5) : 1];
    If_Grp_t G1 = {0};//, G3 = {0};
    int i, nLutLeaf, nLutLeaf2, nLutRoot, Length;
    // stretch the truth table
    assert( nVars >= 6 );
    memcpy( pTruth, pTruth0, sizeof(word) * Abc_TtWordNum(nVars) );
    Abc_TtStretch6( (word *)pTruth, nLeaves, p->pPars->nLutSize );

#ifdef IF_TRY_NEW
    {
        word pCopy[1024];
        int nWords = Abc_TruthWordNum(nVars);
        int iNum;
        if ( s_vTtMem == NULL )
        {
            s_vTtMem = Vec_MemAlloc( Abc_Truth6WordNum(nVars), 12 ); // 32 KB/page for 6-var functions
            Vec_MemHashAlloc( s_vTtMem, 10000 );
        }
        if ( s_vTtMem2 == NULL )
        {
            s_vTtMem2 = Vec_MemAlloc( Abc_Truth6WordNum(nVars), 12 ); // 32 KB/page for 6-var functions
            Vec_MemHashAlloc( s_vTtMem2, 10000 );
        }
        memcpy( pCopy, pTruth, sizeof(word) * Abc_Truth6WordNum(nVars) );
        if ( pCopy[0] & 1 )
            for ( i = 0; i < nWords; i++ )
                pCopy[i] = ~pCopy[i];
        iNum = Vec_MemHashInsert( s_vTtMem, pCopy );
        if ( iNum == Vec_MemEntryNum(s_vTtMem) - 1 )
        {
            int pCanonPerm[16];
            char pCanonPermC[16];
            Abc_TtCanonicize( pCopy, nVars, pCanonPermC );
//            If_CluSemiCanonicize( pCopy, nVars, pCanonPerm );
            Vec_MemHashInsert( s_vTtMem2, pCopy );
        }
    }
#endif

    // if cutmin is disabled, minimize the function
    if ( !p->pPars->fCutMin )
        nLeaves = Abc_TtMinBase( (word *)pTruth, NULL, nLeaves, nVars );

    // quit if parameters are wrong
    Length = strlen(pStr);
    if ( Length != 2 && Length != 3 )
    {
        printf( "Wrong LUT struct (%s)\n", pStr );
        return 0;
    }
    for ( i = 0; i < Length; i++ )
        if ( pStr[i] - '0' < 3 || pStr[i] - '0' > 6 )
        {
            printf( "The LUT size (%d) should belong to {3,4,5,6}.\n", pStr[i] - '0' );
            return 0;
        }

    nLutLeaf  =                   pStr[0] - '0';
    nLutLeaf2 = ( Length == 3 ) ? pStr[1] - '0' : 0;
    nLutRoot  =                   pStr[Length-1] - '0';
    if ( nLeaves > nLutLeaf - 1 + (nLutLeaf2 ? nLutLeaf2 - 1 : 0) + nLutRoot )
    {
        printf( "The cut size (%d) is too large for the LUT structure %s.\n", nLeaves, pStr );
        return 0;
    }
    // consider easy case
    if ( nLeaves <= Abc_MaxInt( nLutLeaf2, Abc_MaxInt(nLutLeaf, nLutRoot) ) )
        return 1;

    // derive the first group
    if ( Length == 2 )
        G1 = If_CluCheck( p, (word *)pTruth, nLeaves, 0, 0, nLutLeaf, nLutRoot, NULL, NULL, NULL, NULL, 1 );
    else
        G1 = If_CluCheck3( p, (word *)pTruth, nLeaves, nLutLeaf, nLutLeaf2, nLutRoot, NULL, NULL, NULL, NULL, NULL );

//    if ( G1.nVars > 0 )
//        If_CluPrintGroup( &G1 );

    return (int)(G1.nVars > 0);
}